

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

int read_angle_delta(aom_reader *r,aom_cdf_prob *cdf)

{
  int iVar1;
  
  iVar1 = aom_read_symbol_(r,cdf,7);
  return iVar1 + -3;
}

Assistant:

static int read_angle_delta(aom_reader *r, aom_cdf_prob *cdf) {
  const int sym = aom_read_symbol(r, cdf, 2 * MAX_ANGLE_DELTA + 1, ACCT_STR);
  return sym - MAX_ANGLE_DELTA;
}